

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O0

void test_rgb2yuv(uint32_t width,uint32_t height,uint8_t *rgb,uint32_t rgb_stride,uint8_t *y,
                 uint8_t *u,uint8_t *v,uint32_t y_stride,uint32_t uv_stride,YCbCrType yuv_type,
                 char *file,char *name,uint32_t iteration_number,rgb2yuv_ptr rgb2yuv_fun)

{
  clock_t cVar1;
  clock_t cVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *out_filename;
  uint32_t i;
  clock_t t;
  uint8_t *u_local;
  uint8_t *y_local;
  uint32_t rgb_stride_local;
  uint8_t *rgb_local;
  uint32_t height_local;
  uint32_t width_local;
  
  cVar1 = clock();
  for (out_filename._4_4_ = 0; out_filename._4_4_ < iteration_number;
      out_filename._4_4_ = out_filename._4_4_ + 1) {
    (*rgb2yuv_fun)(width,height,rgb,rgb_stride,y,u,v,y_stride,uv_stride,yuv_type);
  }
  cVar2 = clock();
  printf("Processing time (%s) : %f sec\n",(double)((float)(cVar2 - cVar1) / 1e+06),name);
  sVar3 = strlen(file);
  sVar4 = strlen(name);
  __dest = (char *)malloc(sVar3 + sVar4 + 6);
  strcpy(__dest,file);
  strcat(__dest,"_");
  strcat(__dest,name);
  strcat(__dest,".yuv");
  saveRawYUV(__dest,width,height,y,(ulong)y_stride,(ulong)uv_stride);
  free(__dest);
  return;
}

Assistant:

void test_rgb2yuv(uint32_t width, uint32_t height, 
	const uint8_t *rgb, uint32_t rgb_stride, 
	uint8_t *y, uint8_t *u, uint8_t *v, uint32_t y_stride, uint32_t uv_stride, YCbCrType yuv_type,
	const char *file, const char *name, uint32_t iteration_number, const rgb2yuv_ptr rgb2yuv_fun)
{
	clock_t t = clock();
	for(uint32_t i=0;i<iteration_number; ++i)
		rgb2yuv_fun(width, height, rgb, rgb_stride, y, u, v, y_stride, uv_stride, yuv_type);
	t = clock()-t;
	printf("Processing time (%s) : %f sec\n", name, ((float)t)/CLOCKS_PER_SEC);
	
	char *out_filename = malloc(strlen(file)+strlen(name)+6);
	strcpy(out_filename, file);
	strcat(out_filename, "_");
	strcat(out_filename, name);
	strcat(out_filename, ".yuv");
	saveRawYUV(out_filename, width, height, y, y_stride, uv_stride);
	free(out_filename);
}